

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbytearray.cpp
# Opt level: O3

QByteArray * QByteArray::toUpper_helper(QByteArray *__return_storage_ptr__,QByteArray *a)

{
  byte bVar1;
  char *pcVar2;
  long lVar3;
  Data *pDVar4;
  longlong __old_val_1;
  iterator pcVar5;
  char *__old_val;
  byte bVar6;
  long lVar7;
  
  pcVar2 = (a->d).ptr;
  lVar3 = (a->d).size;
  if (lVar3 != 0) {
    lVar7 = 0;
    do {
      if ((0xe5 < (byte)(pcVar2[lVar7] + 0x85U) & (pcVar2[lVar7] & 0x20U) >> 5) != 0) {
        pDVar4 = (a->d).d;
        (a->d).d = (Data *)0x0;
        (__return_storage_ptr__->d).d = pDVar4;
        (a->d).ptr = (char *)0x0;
        (__return_storage_ptr__->d).ptr = pcVar2;
        (a->d).size = 0;
        (__return_storage_ptr__->d).size = lVar3;
        pcVar5 = begin(__return_storage_ptr__);
        lVar3 = (__return_storage_ptr__->d).size;
        for (; lVar3 != lVar7; lVar7 = lVar7 + 1) {
          bVar1 = pcVar5[lVar7];
          bVar6 = bVar1 & 0xdf;
          if (0x19 < (byte)(bVar1 + 0x9f)) {
            bVar6 = bVar1;
          }
          pcVar5[lVar7] = bVar6;
        }
        return __return_storage_ptr__;
      }
      lVar7 = lVar7 + 1;
    } while (lVar3 != lVar7);
  }
  pDVar4 = (a->d).d;
  (a->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).d = pDVar4;
  (a->d).ptr = (char *)0x0;
  (__return_storage_ptr__->d).ptr = pcVar2;
  (a->d).size = 0;
  (__return_storage_ptr__->d).size = lVar3;
  return __return_storage_ptr__;
}

Assistant:

QByteArray QByteArray::toUpper_helper(QByteArray &a)
{
    return toCase_template(a, asciiUpper);
}